

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O2

Client __thiscall capnp::EzRpcClient::importCap(EzRpcClient *this,StringPtr name)

{
  TransformPromiseNodeBase *this_00;
  char *in_RCX;
  char *pcVar1;
  ClientHook *extraout_RDX;
  StringPtr name_00;
  Client CVar3;
  StringPtr value;
  Own<kj::_::PromiseNode> local_98;
  Array<char> local_88;
  Own<kj::_::PromiseNode> local_70;
  Own<kj::_::PromiseNode> local_60;
  _func_int **local_50;
  Array<char> local_48;
  Own<kj::_::PromiseNode> local_30;
  ClientHook *pCVar2;
  
  name_00.content.size_ = (kj *)name.content.size_;
  pcVar1 = *(char **)(*(_func_int **)((long)name.content.ptr + 8) + 0x28);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = in_RCX;
    kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_70);
    value.content.size_ = (size_t)pcVar1;
    value.content.ptr = in_RCX;
    kj::heapString((String *)&local_88,name_00.content.size_,value);
    local_48.ptr = local_88.ptr;
    local_48.size_ = local_88.size_;
    local_48.disposer = local_88.disposer;
    local_88.ptr = (char *)0x0;
    local_88.size_ = 0;
    local_50 = (_func_int **)name.content.ptr;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_70,
               kj::
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc.c++:181:9),_kj::String>
               ::operator()<>);
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00672ea8;
    this_00[1].super_PromiseNode._vptr_PromiseNode = local_50;
    this_00[1].dependency.disposer = (Disposer *)local_48.ptr;
    this_00[1].dependency.ptr = (PromiseNode *)local_48.size_;
    this_00[1].continuationTracePtr = local_48.disposer;
    local_48.ptr = (char *)0x0;
    local_48.size_ = 0;
    local_60.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<capnp::Capability::Client,kj::_::Void,kj::CaptureByMove<capnp::EzRpcClient::importCap(kj::StringPtr)::$_0,kj::String>,kj::_::PropagateException>>
          ::instance;
    local_30.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<capnp::Capability::Client,kj::_::Void,kj::CaptureByMove<capnp::EzRpcClient::importCap(kj::StringPtr)::$_0,kj::String>,kj::_::PropagateException>>
          ::instance;
    local_60.ptr = (PromiseNode *)0x0;
    local_98.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<capnp::Capability::Client,kj::_::Void,kj::CaptureByMove<capnp::EzRpcClient::importCap(kj::StringPtr)::$_0,kj::String>,kj::_::PropagateException>>
          ::instance;
    local_30.ptr = (PromiseNode *)0x0;
    local_98.ptr = (PromiseNode *)this_00;
    kj::Own<kj::_::PromiseNode>::dispose(&local_30);
    kj::Own<kj::_::PromiseNode>::dispose(&local_60);
    Capability::Client::Client<capnp::Capability::Client,void>
              ((Client *)this,(Promise<capnp::Capability::Client> *)&local_98);
    kj::Own<kj::_::PromiseNode>::dispose(&local_98);
    kj::Array<char>::~Array(&local_48);
    kj::Array<char>::~Array(&local_88);
    kj::Own<kj::_::PromiseNode>::dispose(&local_70);
    pCVar2 = extraout_RDX;
  }
  else {
    name_00.content.ptr = pcVar1;
    CVar3 = Impl::ClientContext::restore((ClientContext *)this,name_00);
    pCVar2 = CVar3.hook.ptr;
  }
  CVar3.hook.ptr = pCVar2;
  CVar3.hook.disposer = (Disposer *)this;
  return (Client)CVar3.hook;
}

Assistant:

Capability::Client EzRpcClient::importCap(kj::StringPtr name) {
  KJ_IF_MAYBE(client, impl->clientContext) {
    return client->get()->restore(name);
  } else {
    return impl->setupPromise.addBranch().then(kj::mvCapture(kj::heapString(name),
        [this](kj::String&& name) {
      return KJ_ASSERT_NONNULL(impl->clientContext)->restore(name);
    }));
  }
}